

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamNetworkAddress::connectAuthenticated(CapabilityStreamNetworkAddress *this)

{
  PromiseArena *pPVar1;
  NetworkAddress NVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  TransformPromiseNodeBase *this_00;
  NetworkAddress local_28;
  
  local_28._vptr_NetworkAddress = (_func_int **)in_RAX;
  connect((CapabilityStreamNetworkAddress *)&local_28,in_ESI,in_RDX,in_ECX);
  NVar2._vptr_NetworkAddress = local_28._vptr_NetworkAddress;
  pPVar1 = (PromiseArena *)local_28._vptr_NetworkAddress[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_28._vptr_NetworkAddress - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2794:25)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00624100;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_28._vptr_NetworkAddress[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_28._vptr_NetworkAddress + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_28,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2794:25)>
               ::anon_class_1_0_00000001_for_func::operator());
    NVar2._vptr_NetworkAddress[-5] = (_func_int *)&PTR_destroy_00624100;
    ((PromiseArenaMember *)(NVar2._vptr_NetworkAddress + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  NVar2._vptr_NetworkAddress = local_28._vptr_NetworkAddress;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_28._vptr_NetworkAddress != (PromiseArenaMember *)0x0) {
    local_28._vptr_NetworkAddress = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)NVar2._vptr_NetworkAddress);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamNetworkAddress::connectAuthenticated() {
  return connect().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}